

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRectFilledMultiColor
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col_upr_left,ImU32 col_upr_right,
          ImU32 col_bot_right,ImU32 col_bot_left)

{
  uint in_ECX;
  ImVec2 *in_RDX;
  ImVec2 *in_RSI;
  ImDrawList *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  ImVec2 uv;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  
  if (((in_ECX | in_R8D | in_R9D | in_stack_00000008) & 0xff000000) != 0) {
    PrimReserve((ImDrawList *)CONCAT44((in_RDI->_Data->TexUvWhitePixel).x,in_stack_ffffffffffffffd0)
                ,(int)in_stack_ffffffffffffffcc,(int)in_stack_ffffffffffffffc8);
    PrimWriteIdx(in_RDI,in_RDI->_VtxCurrentIdx);
    PrimWriteIdx(in_RDI,in_RDI->_VtxCurrentIdx + 1);
    PrimWriteIdx(in_RDI,in_RDI->_VtxCurrentIdx + 2);
    PrimWriteIdx(in_RDI,in_RDI->_VtxCurrentIdx);
    PrimWriteIdx(in_RDI,in_RDI->_VtxCurrentIdx + 2);
    PrimWriteIdx(in_RDI,in_RDI->_VtxCurrentIdx + 3);
    PrimWriteVtx(in_RDI,in_RSI,(ImVec2 *)&stack0xffffffffffffffd4,in_ECX);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,in_RDX->x,in_RSI->y);
    PrimWriteVtx(in_RDI,(ImVec2 *)&stack0xffffffffffffffcc,(ImVec2 *)&stack0xffffffffffffffd4,in_R8D
                );
    PrimWriteVtx(in_RDI,in_RDX,(ImVec2 *)&stack0xffffffffffffffd4,in_R9D);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,in_RSI->x,in_RDX->y);
    PrimWriteVtx(in_RDI,(ImVec2 *)&stack0xffffffffffffffc4,(ImVec2 *)&stack0xffffffffffffffd4,
                 in_stack_00000008);
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilledMultiColor(const ImVec2& p_min, const ImVec2& p_max, ImU32 col_upr_left, ImU32 col_upr_right, ImU32 col_bot_right, ImU32 col_bot_left)
{
    if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    PrimReserve(6, 4);
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+1)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2));
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+3));
    PrimWriteVtx(p_min, uv, col_upr_left);
    PrimWriteVtx(ImVec2(p_max.x, p_min.y), uv, col_upr_right);
    PrimWriteVtx(p_max, uv, col_bot_right);
    PrimWriteVtx(ImVec2(p_min.x, p_max.y), uv, col_bot_left);
}